

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O1

void __thiscall VSlider::on_mouse_button_hold(VSlider *this,int mx,int my)

{
  int iVar1;
  double dVar2;
  double dVar3;
  
  iVar1 = (*(this->super_Widget)._vptr_Widget[0x10])();
  if ((char)iVar1 == '\0') {
    iVar1 = (this->super_Widget).y2;
    dVar2 = (double)(~my + iVar1) / (double)(uint)(~(this->super_Widget).y1 + iVar1);
    dVar3 = 1.0;
    if (dVar2 <= 1.0) {
      dVar3 = dVar2;
    }
    if (dVar3 <= 0.0) {
      dVar3 = 0.0;
    }
    *(int *)&(this->super_Widget).field_0x34 = (int)((double)this->max_value * dVar3);
    ((this->super_Widget).dialog)->draw_requested = true;
  }
  return;
}

Assistant:

void VSlider::on_mouse_button_hold(int mx, int my)
{
   if (is_disabled())
      return;

   double r = (double) (this->y2 - 1 - my) / (this->height() - 2);
   r = CLAMP(0.0, r, 1.0);
   cur_value = (int) (r * max_value);
   dialog->request_draw();

   (void)mx;
}